

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O1

PyObject * libxml_xmlIsXHTML(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  xmlChar *publicID;
  xmlChar *systemID;
  undefined8 local_18;
  undefined8 local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"zz:xmlIsXHTML",&local_10,&local_18);
  if (iVar1 != 0) {
    iVar1 = xmlIsXHTML(local_10,local_18);
    pPVar2 = libxml_intWrap(iVar1);
  }
  return pPVar2;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlIsXHTML(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlChar * systemID;
    xmlChar * publicID;

    if (!PyArg_ParseTuple(args, (char *)"zz:xmlIsXHTML", &systemID, &publicID))
        return(NULL);

    c_retval = xmlIsXHTML(systemID, publicID);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}